

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QString * QDateTimePrivate::localNameAtMillis
                    (QString *__return_storage_ptr__,qint64 millis,DaylightStatus dst)

{
  bool bVar1;
  int iVar2;
  QFlagsStorage<QDateTimePrivate::TransitionOption> resolve;
  QArrayData *data;
  long in_FS_OFFSET;
  R_conflict17 RVar3;
  QTimeZone sys;
  Data local_50;
  undefined1 local_48 [16];
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  resolve.i = 0x442;
  if (dst == DaylightTime) {
    resolve.i = 0x424;
  }
  if (millisInSystemRange(long_long,long_long)::bounds == '\0') {
    iVar2 = __cxa_guard_acquire(&millisInSystemRange(long_long,long_long)::bounds);
    if (iVar2 != 0) {
      QLocalTime::computeSystemMillisRange();
      __cxa_guard_release(&millisInSystemRange(long_long,long_long)::bounds);
    }
  }
  if (((DAT_006b4980 == '\0') &&
      (millis < millisInSystemRange(long_long,long_long)::bounds + -86400000)) ||
     ((DAT_006b4981 == '\0' && (DAT_006b4978 + 86400000 < millis)))) {
    data = (QArrayData *)0x0;
  }
  else {
    QLocalTime::localTimeAbbbreviationAt((QString *)local_48,millis,(TransitionOptions)resolve.i);
    data = (QArrayData *)local_48._0_8_;
    if (local_38 != (undefined1 *)0x0) {
      (__return_storage_ptr__->d).d = (Data *)local_48._0_8_;
      (__return_storage_ptr__->d).ptr = (char16_t *)local_48._8_8_;
      (__return_storage_ptr__->d).size = (qsizetype)local_38;
      goto LAB_00347b8a;
    }
  }
  local_50.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QTimeZone::systemTimeZone();
  bVar1 = QTimeZone::isValid((QTimeZone *)&local_50.s);
  if (bVar1) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTimeZonePrivate::stateAtZoneTime
              ((ZoneState *)local_48,local_50.d,millis,(TransitionOptions)resolve.i);
    if (local_38._0_1_ != true) goto LAB_00347b49;
    (*(local_50.d)->_vptr_QTimeZonePrivate[7])
              (__return_storage_ptr__,local_50.d,
               (undefined1 *)((long)(int)local_48._8_4_ * -1000 + local_48._0_8_));
  }
  else {
LAB_00347b49:
    RVar3 = millisToWithinRange(millis);
    if (((undefined1  [16])RVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      QLocalTime::localTimeAbbbreviationAt
                (__return_storage_ptr__,RVar3.shifted,(TransitionOptions)resolve.i);
    }
  }
  QTimeZone::~QTimeZone((QTimeZone *)&local_50.s);
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
LAB_00347b8a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QDateTimePrivate::localNameAtMillis(qint64 millis, DaylightStatus dst)
{
    const QDateTimePrivate::TransitionOptions resolve = toTransitionOptions(dst);
    QString abbreviation;
    if (millisInSystemRange(millis, MSECS_PER_DAY)) {
        abbreviation = QLocalTime::localTimeAbbbreviationAt(millis, resolve);
        if (!abbreviation.isEmpty())
            return abbreviation;
    }

    // Otherwise, outside the system range.
#if QT_CONFIG(timezone)
    // Use the system zone:
    const auto sys = QTimeZone::systemTimeZone();
    if (sys.isValid()) {
        ZoneState state = zoneStateAtMillis(sys, millis, resolve);
        if (state.valid)
            return sys.d->abbreviation(state.when - state.offset * MSECS_PER_SEC);
    }
#endif // timezone

    // Kludge
    // Use a time in the system range with the same day-of-week pattern to its year:
    auto fake = millisToWithinRange(millis);
    if (Q_LIKELY(fake.good))
        return QLocalTime::localTimeAbbbreviationAt(fake.shifted, resolve);

    // Overflow, apparently.
    return {};
}